

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v11::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int b;
  bigit bVar2;
  ulong uVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bigit rhs_bigit;
  double_bigit sum;
  int i;
  int min_exp;
  double_bigit borrow;
  int num_rhs_bigits;
  int max_lhs_bigits;
  bigint *in_stack_ffffffffffffffb0;
  bigit in_stack_ffffffffffffffbc;
  bigint *in_stack_ffffffffffffffc0;
  int local_38;
  long local_30;
  int local_4;
  
  iVar1 = bigint::num_bigits(in_stack_ffffffffffffffb0);
  b = bigint::num_bigits(in_stack_ffffffffffffffb0);
  iVar1 = max_of<int>(iVar1,b);
  local_38 = bigint::num_bigits(in_stack_ffffffffffffffb0);
  if (iVar1 + 1 < local_38) {
    local_4 = -1;
  }
  else if (local_38 < iVar1) {
    local_4 = 1;
  }
  else {
    local_30 = 0;
    iVar1 = min_of<int>(*(int *)(in_RDI + 0xa0),*(int *)(in_RSI + 0xa0));
    iVar1 = min_of<int>(iVar1,*(int *)(in_RDX + 0xa0));
    while (local_38 = local_38 + -1, iVar1 <= local_38) {
      bVar2 = bigint::get_bigit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      uVar3 = (ulong)bVar2;
      bVar2 = bigint::get_bigit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffc0 = (bigint *)(uVar3 + bVar2);
      in_stack_ffffffffffffffbc =
           bigint::get_bigit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if ((bigint *)((ulong)in_stack_ffffffffffffffbc + local_30) < in_stack_ffffffffffffffc0) {
        return 1;
      }
      uVar3 = ((ulong)in_stack_ffffffffffffffbc + local_30) - (long)in_stack_ffffffffffffffc0;
      if (1 < uVar3) {
        return -1;
      }
      local_30 = uVar3 << 0x20;
    }
    local_4 = 0;
    if (local_30 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR auto add_compare(const bigint& lhs1, const bigint& lhs2,
                                        const bigint& rhs) -> int {
    int max_lhs_bigits = max_of(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    double_bigit borrow = 0;
    int min_exp = min_of(min_of(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum = double_bigit(lhs1.get_bigit(i)) + lhs2.get_bigit(i);
      bigit rhs_bigit = rhs.get_bigit(i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }